

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

aiMesh ** unique_to_array<aiMesh>
                    (vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                     *v)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  reference this;
  pointer paVar5;
  ulong local_28;
  size_t i;
  aiMesh **p;
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  *v_local;
  
  bVar2 = std::
          vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
          ::empty(v);
  if (bVar2) {
    v_local = (vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               *)0x0;
  }
  else {
    sVar3 = std::
            vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
            ::size(v);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    v_local = (vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               *)operator_new__(uVar4);
    for (local_28 = 0;
        sVar3 = std::
                vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                ::size(v), local_28 < sVar3; local_28 = local_28 + 1) {
      this = std::
             vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
             ::operator[](v,local_28);
      paVar5 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::release(this);
      (&(v_local->
        super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start)[local_28] = (pointer)paVar5;
    }
  }
  return (aiMesh **)v_local;
}

Assistant:

T **unique_to_array( vector<std::unique_ptr<T> > &v ){
    if( v.empty() ) {
        return 0;
    }
    T **p = new T*[ v.size() ];
    for( size_t i = 0; i < v.size(); ++i ){
        p[i] = v[i].release();
    }
    return p;
}